

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_format_value.cpp
# Opt level: O2

ExceptionFormatValue *
duckdb::ExceptionFormatValue::CreateFormatValue<duckdb::PhysicalType>
          (ExceptionFormatValue *__return_storage_ptr__,PhysicalType value)

{
  PhysicalType in_DL;
  undefined7 in_register_00000031;
  string local_30;
  
  TypeIdToString_abi_cxx11_(&local_30,(duckdb *)CONCAT71(in_register_00000031,value),in_DL);
  ExceptionFormatValue(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

ExceptionFormatValue ExceptionFormatValue::CreateFormatValue(PhysicalType value) {
	return ExceptionFormatValue(TypeIdToString(value));
}